

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misc.c
# Opt level: O0

char * riscos_path(char *s)

{
  size_t sVar1;
  char *local_20;
  char *cptr;
  char *s_local;
  
  if (riscos_path::riscosname != (char *)0x0) {
    free(riscos_path::riscosname);
  }
  sVar1 = strlen(s);
  riscos_path::riscosname = (char *)malloc(sVar1 + 1);
  local_20 = riscos_path::riscosname;
  cptr = s;
  if (riscos_path::riscosname == (char *)0x0) {
    s_local = (char *)0x0;
  }
  else {
    for (; *cptr != '\0'; cptr = cptr + 1) {
      if (*cptr == '/') {
        *local_20 = '.';
      }
      else {
        *local_20 = *cptr;
      }
      local_20 = local_20 + 1;
    }
    *local_20 = '\0';
    s_local = riscos_path::riscosname;
  }
  return s_local;
}

Assistant:

char *
riscos_path(register char *s)
{
	static char *riscosname = NULL;
	register char *cptr;

	if (riscosname)
		free(riscosname);

	riscosname = malloc(strlen(s) + 1);
	if (!riscosname)
		return (NULL);
	for (cptr = riscosname; *s; s++, cptr++)
		if (*s == PATHSEP)
			*cptr = '.';
		else
			*cptr = *s;
	*cptr = '\0';
	return (riscosname);
}